

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_writer.cpp
# Opt level: O0

void write_maps_key_door_masks(World *world,ROM *rom)

{
  bool bVar1;
  uint16_t word;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this;
  reference __in;
  type *ppMVar2;
  vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_> *this_00;
  LandstalkerException *this_01;
  allocator<char> local_99;
  string local_98;
  uint16_t local_72;
  reference pGStack_70;
  uint16_t flag_bytes;
  GlobalEntityMaskFlag *global_mask_flags;
  iterator __end2;
  iterator __begin2;
  vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_> *__range2;
  type *map;
  type *map_id;
  _Self local_38;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *__range1;
  uint32_t addr;
  ROM *rom_local;
  World *world_local;
  
  __range1._4_4_ = 0x1aacc;
  this = World::maps(world);
  __end1 = std::
           map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
           ::begin(this);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
       ::end(this);
  while( true ) {
    bVar1 = std::operator==(&__end1,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __in = std::_Rb_tree_const_iterator<std::pair<const_unsigned_short,_Map_*>_>::operator*(&__end1)
    ;
    std::get<0ul,unsigned_short_const,Map*>(__in);
    ppMVar2 = std::get<1ul,unsigned_short_const,Map*>(__in);
    this_00 = Map::key_door_mask_flags(*ppMVar2);
    __end2 = std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::begin
                       (this_00);
    global_mask_flags =
         (GlobalEntityMaskFlag *)
         std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
                        (&__end2,(__normal_iterator<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
                                  *)&global_mask_flags);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pGStack_70 = __gnu_cxx::
                   __normal_iterator<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
                   ::operator*(&__end2);
      local_72 = GlobalEntityMaskFlag::to_bytes(pGStack_70);
      word = Map::id(*ppMVar2);
      md::ROM::set_word(rom,__range1._4_4_,word);
      md::ROM::set_word(rom,__range1._4_4_ + 2,local_72);
      __range1._4_4_ = __range1._4_4_ + 4;
      __gnu_cxx::
      __normal_iterator<GlobalEntityMaskFlag_*,_std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>_>
      ::operator++(&__end2);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_short,_Map_*>_>::operator++(&__end1);
  }
  md::ROM::set_word(rom,__range1._4_4_,0xffff);
  if (0x1aaf6 < __range1._4_4_ + 2) {
    this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,
               "Map key door clear flags table must not be bigger than the one from base game",
               &local_99);
    LandstalkerException::LandstalkerException(this_01,&local_98);
    __cxa_throw(this_01,&LandstalkerException::typeinfo,LandstalkerException::~LandstalkerException)
    ;
  }
  md::ROM::mark_empty_chunk(rom,__range1._4_4_ + 2,0x1aaf6);
  return;
}

Assistant:

static void write_maps_key_door_masks(const World& world, md::ROM& rom)
{
    uint32_t addr = offsets::MAP_CLEAR_KEY_DOOR_FLAGS_TABLE;

    for(auto& [map_id, map] : world.maps())
    {
        for(const GlobalEntityMaskFlag& global_mask_flags : map->key_door_mask_flags())
        {
            uint16_t flag_bytes = global_mask_flags.to_bytes();
            rom.set_word(addr, map->id());
            rom.set_word(addr+2, flag_bytes);
            addr += 0x4;
        }
    }

    rom.set_word(addr, 0xFFFF);
    addr += 0x2;
    if(addr > offsets::MAP_CLEAR_KEY_DOOR_FLAGS_TABLE_END)
        throw LandstalkerException("Map key door clear flags table must not be bigger than the one from base game");
    rom.mark_empty_chunk(addr, offsets::MAP_CLEAR_KEY_DOOR_FLAGS_TABLE_END);
}